

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O2

void __thiscall chrono::collision::CHOBB::CHOBB(CHOBB *this)

{
  double dVar1;
  
  *(undefined8 *)((long)(this->To).m_data + 0x14) = 0;
  *(undefined8 *)((long)(this->d).m_data + 4) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0xc) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0x14) = 0;
  (this->To).m_data[0] = 0.0;
  (this->To).m_data[1] = 0.0;
  (this->To).m_data[2] = 0.0;
  (this->d).m_data[0] = 0.0;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            ((Matrix<double,_3,_3,_1,_3,_3> *)this);
  dVar1 = DAT_011dd3e0;
  if (this != (CHOBB *)Q_FLIP_AROUND_Y) {
    (this->To).m_data[0] = VNULL;
    (this->To).m_data[1] = dVar1;
    (this->To).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (CHOBB *)(Q_FLIP_AROUND_X + 8)) {
    (this->d).m_data[0] = VNULL;
    (this->d).m_data[1] = dVar1;
    (this->d).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

CHOBB::CHOBB() {
    first_child = 0;

    Rot.setIdentity();

    To = VNULL;
    d = VNULL;
}